

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_suite.cpp
# Opt level: O0

void replace_u32string(void)

{
  bool bVar1;
  type tVar2;
  basic_variable<std::allocator<char>_> local_ac8;
  basic_variable<std::allocator<char>_> local_a98;
  iterator local_a68;
  iterator local_a50;
  basic_variable<std::allocator<char>_> local_a38;
  basic_variable<std::allocator<char>_> local_a08;
  iterator local_9d8;
  iterator local_9c0;
  undefined1 local_9a8 [8];
  variable data_7;
  basic_variable<std::allocator<char>_> local_948;
  iterator local_918;
  iterator local_900;
  basic_variable<std::allocator<char>_> local_8e8;
  basic_variable<std::allocator<char>_> local_8b8;
  iterator local_888;
  iterator local_870;
  undefined1 local_858 [8];
  variable data_6;
  basic_variable<std::allocator<char>_> local_7f8;
  iterator local_7c8;
  iterator local_7b0;
  basic_variable<std::allocator<char>_> local_798;
  basic_variable<std::allocator<char>_> local_768;
  iterator local_738;
  iterator local_720;
  undefined1 local_708 [8];
  variable data_5;
  basic_variable<std::allocator<char>_> local_6a8;
  iterator local_678;
  iterator local_660;
  basic_variable<std::allocator<char>_> local_648;
  basic_variable<std::allocator<char>_> local_618;
  iterator local_5e8;
  iterator local_5d0;
  undefined1 local_5b8 [8];
  variable data_4;
  double local_580;
  basic_variable<std::allocator<char>_> local_578;
  basic_variable<std::allocator<char>_> local_548;
  iterator local_518;
  iterator local_500;
  basic_variable<std::allocator<char>_> local_4e8;
  basic_variable<std::allocator<char>_> local_4b8;
  iterator local_488;
  iterator local_470;
  undefined1 local_458 [8];
  variable data_3;
  int local_41c;
  basic_variable<std::allocator<char>_> local_418;
  basic_variable<std::allocator<char>_> local_3e8;
  iterator local_3b8;
  iterator local_3a0;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  iterator local_328;
  iterator local_310;
  undefined1 local_2f8 [8];
  variable data_2;
  bool local_2b9;
  basic_variable<std::allocator<char>_> local_2b8;
  basic_variable<std::allocator<char>_> local_288;
  iterator local_258;
  iterator local_240;
  basic_variable<std::allocator<char>_> local_228;
  basic_variable<std::allocator<char>_> local_1f8;
  iterator local_1c8;
  iterator local_1b0;
  undefined1 local_198 [8];
  variable data_1;
  basic_variable<std::allocator<char>_> local_138;
  iterator local_108;
  iterator local_f0;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  iterator local_78;
  iterator local_50;
  undefined1 local_38 [8];
  variable data;
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_50,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_78,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a8,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_d8);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_50,&local_78,&local_a8,&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_50);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x217,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_38,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x218,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_f0,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_108,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_138,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_f0,&local_108,&local_138,
             (basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_1.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_138);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::nullable>
                    ((basic_variable<std::allocator<char>_> *)local_38);
  boost::detail::test_impl
            ("data.is<nullable>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x21a,"void replace_u32string()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_198,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1b0,(basic_variable<std::allocator<char>_> *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1c8,(basic_variable<std::allocator<char>_> *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_1f8,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_228,true);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_1b0,&local_1c8,&local_1f8,&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_228);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_198);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x220,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_198,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x221,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_240,(basic_variable<std::allocator<char>_> *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_258,(basic_variable<std::allocator<char>_> *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_288,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2b8,true);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_240,&local_258,&local_288,&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_288);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_240);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::boolean>
                    ((basic_variable<std::allocator<char>_> *)local_198);
  boost::detail::test_impl
            ("data.is<boolean>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x223,"void replace_u32string()",bVar1);
  local_2b9 = true;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_198,&local_2b9);
  boost::detail::test_impl
            ("data == true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x224,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2f8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_310,(basic_variable<std::allocator<char>_> *)local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_328,(basic_variable<std::allocator<char>_> *)local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_388,2);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_310,&local_328,&local_358,&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_328);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_310);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_2f8);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x22a,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_2f8,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x22b,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3a0,(basic_variable<std::allocator<char>_> *)local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_3b8,(basic_variable<std::allocator<char>_> *)local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3e8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_418,2);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_3a0,&local_3b8,&local_3e8,&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3a0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::integer>
                    ((basic_variable<std::allocator<char>_> *)local_2f8);
  boost::detail::test_impl
            ("data.is<integer>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x22d,"void replace_u32string()",bVar1);
  local_41c = 2;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_2f8,&local_41c);
  boost::detail::test_impl
            ("data == 2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x22e,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_2f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_458,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_470,(basic_variable<std::allocator<char>_> *)local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_488,(basic_variable<std::allocator<char>_> *)local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4b8,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_4e8,3.0);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_470,&local_488,&local_4b8,&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_470);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_458);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x234,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_458,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x235,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_500,(basic_variable<std::allocator<char>_> *)local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_518,(basic_variable<std::allocator<char>_> *)local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_548,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_578,3.0);
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_500,&local_518,&local_548,&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_500);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::real>
                    ((basic_variable<std::allocator<char>_> *)local_458);
  boost::detail::test_impl
            ("data.is<real>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x237,"void replace_u32string()",bVar1);
  local_580 = 3.0;
  tVar2 = trial::dynamic::operator==((basic_variable<std::allocator<char>_> *)local_458,&local_580);
  boost::detail::test_impl
            ("data == 3.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x238,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_5b8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_5d0,(basic_variable<std::allocator<char>_> *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_5e8,(basic_variable<std::allocator<char>_> *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_618,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_648,"alpha");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_5d0,&local_5e8,&local_618,&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_648);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_5d0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_5b8);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x23e,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_5b8,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x23f,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_660,(basic_variable<std::allocator<char>_> *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_678,(basic_variable<std::allocator<char>_> *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_5.storage.field_0x28,"alpha");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_660,&local_678,&local_6a8,
             (basic_variable<std::allocator<char>_> *)&data_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_5.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_678);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_660);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::string>
                    ((basic_variable<std::allocator<char>_> *)local_5b8);
  boost::detail::test_impl
            ("data.is<string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x241,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_5b8,(char (*) [6])"alpha");
  boost::detail::test_impl
            ("data == \"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x242,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_708,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_720,(basic_variable<std::allocator<char>_> *)local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_738,(basic_variable<std::allocator<char>_> *)local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_768,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_798,L"bravo");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_720,&local_738,&local_768,&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_798);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_720);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_708);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x248,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_708,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x249,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_7b0,(basic_variable<std::allocator<char>_> *)local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_7c8,(basic_variable<std::allocator<char>_> *)local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_7f8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_6.storage.field_0x28,L"bravo");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_7b0,&local_7c8,&local_7f8,
             (basic_variable<std::allocator<char>_> *)&data_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_6.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_7b0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::wstring>
                    ((basic_variable<std::allocator<char>_> *)local_708);
  boost::detail::test_impl
            ("data.is<wstring>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x24b,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_708,(wchar_t (*) [6])L"bravo");
  boost::detail::test_impl
            ("data == L\"bravo\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x24c,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_858,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_870,(basic_variable<std::allocator<char>_> *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_888,(basic_variable<std::allocator<char>_> *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_8b8,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_8e8,L"charlie");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_870,&local_888,&local_8b8,&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_888);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_870);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_858);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x252,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_858,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x253,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_900,(basic_variable<std::allocator<char>_> *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_918,(basic_variable<std::allocator<char>_> *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_948,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_7.storage.field_0x28,L"charlie");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_900,&local_918,&local_948,
             (basic_variable<std::allocator<char>_> *)&data_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&data_7.storage.field_0x28);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_918);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_900);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u16string>
                    ((basic_variable<std::allocator<char>_> *)local_858);
  boost::detail::test_impl
            ("data.is<u16string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x255,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_858,(char16_t (*) [8])L"charlie"
                    );
  boost::detail::test_impl
            ("data == u\"charlie\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x256,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_858);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            ((basic_variable<std::allocator<char>_> *)local_9a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_9c0,(basic_variable<std::allocator<char>_> *)local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_9d8,(basic_variable<std::allocator<char>_> *)local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a08,L"zulu");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a38,L"hydrogen");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_9c0,&local_9d8,&local_a08,&local_a38);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a38);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a08);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_9c0);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_9a8);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x25c,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_9a8,(char32_t (*) [6])L"delta");
  boost::detail::test_impl
            ("data == U\"delta\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x25d,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_a50,(basic_variable<std::allocator<char>_> *)local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_a68,(basic_variable<std::allocator<char>_> *)local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_a98,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_ac8,L"hydrogen");
  std::
  replace<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>>
            (&local_a50,&local_a68,&local_a98,&local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ac8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a98);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a68);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_a50);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::is<trial::dynamic::u32string>
                    ((basic_variable<std::allocator<char>_> *)local_9a8);
  boost::detail::test_impl
            ("data.is<u32string>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x25f,"void replace_u32string()",bVar1);
  tVar2 = trial::dynamic::operator==
                    ((basic_variable<std::allocator<char>_> *)local_9a8,
                     (char32_t (*) [9])L"hydrogen");
  boost::detail::test_impl
            ("data == U\"hydrogen\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/replace_suite.cpp"
             ,0x260,"void replace_u32string()",tVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_9a8);
  return;
}

Assistant:

void replace_u32string()
{
    // u32string - null
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable());
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable());
        TRIAL_PROTOCOL_TEST(data.is<nullable>());
    }
    // u32string - boolean
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable(true));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable(true));
        TRIAL_PROTOCOL_TEST(data.is<boolean>());
        TRIAL_PROTOCOL_TEST(data == true);
    }
    // u32string - integer
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable(2));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable(2));
        TRIAL_PROTOCOL_TEST(data.is<integer>());
        TRIAL_PROTOCOL_TEST(data == 2);
    }
    // u32string - real
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable(3.0));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable(3.0));
        TRIAL_PROTOCOL_TEST(data.is<real>());
        TRIAL_PROTOCOL_TEST(data == 3.0);
    }
    // u32string - string
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable("alpha"));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable("alpha"));
        TRIAL_PROTOCOL_TEST(data.is<string>());
        TRIAL_PROTOCOL_TEST(data == "alpha");
    }
    // u32string - wstring
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable(L"bravo"));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable(L"bravo"));
        TRIAL_PROTOCOL_TEST(data.is<wstring>());
        TRIAL_PROTOCOL_TEST(data == L"bravo");
    }
    // u32string - u16string
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable(u"charlie"));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable(u"charlie"));
        TRIAL_PROTOCOL_TEST(data.is<u16string>());
        TRIAL_PROTOCOL_TEST(data == u"charlie");
    }
    // u32string - u32string
    {
        variable data(U"delta");
        std::replace(data.begin(), data.end(), variable(U"zulu"), variable(U"hydrogen"));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"delta");
        std::replace(data.begin(), data.end(), variable(U"delta"), variable(U"hydrogen"));
        TRIAL_PROTOCOL_TEST(data.is<u32string>());
        TRIAL_PROTOCOL_TEST(data == U"hydrogen");
    }
}